

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validator_mq.c
# Opt level: O0

void validator_mq_send(mqd_t validator_mq,_Bool start,_Bool halt,_Bool completed,_Bool finish,
                      _Bool accepted,pid_t tester_pid,char *word,_Bool *err)

{
  size_t __n;
  byte local_804;
  byte local_803;
  byte local_802;
  byte local_801;
  byte local_800;
  pid_t local_7fc;
  undefined1 auStack_7f8 [1004];
  undefined1 local_40c [8];
  validator_mq_msg msg;
  _Bool accepted_local;
  _Bool finish_local;
  _Bool completed_local;
  _Bool halt_local;
  _Bool start_local;
  mqd_t validator_mq_local;
  
  msg.word[999] = accepted;
  msg.word[1000] = finish;
  msg._1013_1_ = completed;
  msg._1014_1_ = halt;
  msg._1015_1_ = start;
  memset(local_40c,0,0x3f8);
  local_804 = msg._1015_1_ & 1;
  local_803 = msg._1014_1_ & 1;
  local_802 = msg._1013_1_ & 1;
  local_801 = msg.word[1000] & 1;
  local_800 = msg.word[999] & 1;
  local_7fc = tester_pid;
  memcpy(auStack_7f8,"",0x3e9);
  memcpy(local_40c,&local_804,0x3f8);
  if (word != (char *)0x0) {
    __n = strlen(word);
    memcpy(&msg.accepted,word,__n);
  }
  validator_mq_send_msg(validator_mq,(validator_mq_msg *)local_40c,err);
  if ((*err & 1U) != 0) {
    if (err != (_Bool *)0x0) {
      *err = true;
    }
    log_formatted("Fail in %s, function: %s",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kowaalczyk[P]concurrent-word-validator/src/validator_mq.c"
                  ,"validator_mq_send");
  }
  return;
}

Assistant:

void validator_mq_send(mqd_t validator_mq, bool start, bool halt, bool completed, bool finish, bool accepted,
                       pid_t tester_pid, const char *word, bool *err) {
    assert(err != NULL);

    validator_mq_msg msg;
    memset(&msg, 0, sizeof(validator_mq_msg)); // to prevent valgrind errors
    msg = (validator_mq_msg){start, halt, completed, finish, accepted, tester_pid, ""};
    if(word != NULL) {
        memcpy(msg.word, word, strlen(word));
    }

    validator_mq_send_msg(validator_mq, &msg, err);
    VOID_FAIL_IF(*err);
}